

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE *fp)

{
  ncnn_datareader_t p_Var1;
  FILE *fp_00;
  ncnn_datareader_t dr;
  ncnn_datareader_t _dr;
  DataReaderFromStdio_c_api *in_stack_ffffffffffffffe0;
  
  _dr = (ncnn_datareader_t)&DAT_00000018;
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  fp_00 = (FILE *)operator_new((ulong)_dr);
  DataReaderFromStdio_c_api::DataReaderFromStdio_c_api(in_stack_ffffffffffffffe0,fp_00,_dr);
  p_Var1->pthis = fp_00;
  p_Var1->scan = __ncnn_DataReaderFromStdio_scan;
  p_Var1->read = __ncnn_DataReaderFromStdio_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_stdio(FILE* fp)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromStdio_c_api(fp, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromStdio_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromStdio_read;
    return dr;
}